

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string __thiscall crnlib::operator+(crnlib *this,dynamic_string *a,dynamic_string *b)

{
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar1;
  dynamic_string dVar2;
  dynamic_string dStack_28;
  
  dynamic_string::dynamic_string(&dStack_28,a);
  dynamic_string::append(&dStack_28,b);
  dynamic_string::dynamic_string((dynamic_string *)this,&dStack_28);
  pcVar1 = extraout_RDX;
  if ((dStack_28.m_pStr != (char *)0x0) &&
     ((*(uint *)(dStack_28.m_pStr + -8) ^ *(uint *)(dStack_28.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(dStack_28.m_pStr + -0x10);
    pcVar1 = extraout_RDX_00;
  }
  dVar2.m_pStr = pcVar1;
  dVar2._0_8_ = this;
  return dVar2;
}

Assistant:

dynamic_string operator+(const dynamic_string& a, const dynamic_string& b) {
  return dynamic_string(a).append(b);
}